

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalSet::Deserialize(LogicalSet *this,Deserializer *deserializer)

{
  SetScope scope_p;
  LogicalSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Value value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  Value local_98;
  Value local_58;
  
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&local_d8,deserializer,200,"name");
  Deserializer::ReadProperty<duckdb::Value>(&local_58,deserializer,0xc9,"value");
  scope_p = Deserializer::ReadProperty<duckdb::SetScope>(deserializer,0xca,"scope");
  this_00 = (LogicalSet *)operator_new(0xd0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    local_b8.field_2._8_8_ = local_d8.field_2._8_8_;
  }
  else {
    local_b8._M_dataplus._M_p = local_d8._M_dataplus._M_p;
  }
  local_b8._M_string_length = local_d8._M_string_length;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  Value::Value(&local_98,&local_58);
  LogicalSet(this_00,&local_b8,&local_98,scope_p);
  Value::~Value(&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  Value::~Value(&local_58);
  ::std::__cxx11::string::~string((string *)&local_d8);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalSet::Deserialize(Deserializer &deserializer) {
	auto name = deserializer.ReadPropertyWithDefault<string>(200, "name");
	auto value = deserializer.ReadProperty<Value>(201, "value");
	auto scope = deserializer.ReadProperty<SetScope>(202, "scope");
	auto result = duckdb::unique_ptr<LogicalSet>(new LogicalSet(std::move(name), value, scope));
	return std::move(result);
}